

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llb3Image.c
# Opt level: O2

void Llb_NonlinAddPartition(Llb_Mgr_t *p,int i,DdNode *bFunc)

{
  int iVar1;
  Llb_Prt_t *pLVar2;
  Vec_Int_t *pVVar3;
  long lVar4;
  int iVar5;
  
  if (*(int *)((ulong)bFunc & 0xfffffffffffffffe) != 0x7fffffff) {
    iVar5 = 1;
    pLVar2 = (Llb_Prt_t *)calloc(1,0x18);
    p->pParts[i] = pLVar2;
    pLVar2 = p->pParts[i];
    pLVar2->iPart = i;
    pLVar2->bFunc = bFunc;
    pVVar3 = Vec_IntAlloc(iVar5);
    p->pParts[i]->vVars = pVVar3;
    Extra_SupportArray(p->dd,bFunc,p->pSupp);
    iVar5 = 0;
    for (lVar4 = 0; lVar4 < p->nVars; lVar4 = lVar4 + 1) {
      iVar1 = p->pSupp[lVar4];
      if ((iVar1 != 0) && (p->pVars2Q[lVar4] != 0)) {
        Llb_NonlinAddPair(p,bFunc,i,(int)lVar4);
      }
      iVar5 = iVar5 + iVar1;
    }
    if (iVar5 < p->nSuppMax) {
      iVar5 = p->nSuppMax;
    }
    p->nSuppMax = iVar5;
    return;
  }
  __assert_fail("!Cudd_IsConstant(bFunc)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/bdd/llb/llb3Image.c"
                ,0x277,"void Llb_NonlinAddPartition(Llb_Mgr_t *, int, DdNode *)");
}

Assistant:

void Llb_NonlinAddPartition( Llb_Mgr_t * p, int i, DdNode * bFunc )
{
    int k, nSuppSize;
    assert( !Cudd_IsConstant(bFunc) );
    // create partition
    p->pParts[i] = ABC_CALLOC( Llb_Prt_t, 1 );
    p->pParts[i]->iPart = i;
    p->pParts[i]->bFunc = bFunc;
    p->pParts[i]->vVars = Vec_IntAlloc( 8 );
    // add support dependencies
    nSuppSize = 0;
    Extra_SupportArray( p->dd, bFunc, p->pSupp );
    for ( k = 0; k < p->nVars; k++ )
    {
        nSuppSize += p->pSupp[k];
        if ( p->pSupp[k] && p->pVars2Q[k] )
            Llb_NonlinAddPair( p, bFunc, i, k );
    }
    p->nSuppMax = Abc_MaxInt( p->nSuppMax, nSuppSize ); 
}